

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

wchar_t archive_read_disk_set_uname_lookup
                  (archive *_a,void *private_data,_func_char_ptr_void_ptr_la_int64_t *lookup_uname,
                  _func_void_void_ptr *cleanup_uname)

{
  long lVar1;
  int iVar2;
  wchar_t wVar3;
  
  iVar2 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_set_uname_lookup");
  wVar3 = L'\xffffffe2';
  if (iVar2 != -0x1e) {
    if (((code *)_a[1].current_code != (code *)0x0) &&
       (lVar1._0_4_ = _a[1].current_codepage, lVar1._4_4_ = _a[1].current_oemcp, lVar1 != 0)) {
      (*(code *)_a[1].current_code)();
    }
    _a[1].error_string.buffer_length = (size_t)lookup_uname;
    _a[1].current_code = (char *)cleanup_uname;
    *(void **)&_a[1].current_codepage = private_data;
    wVar3 = L'\0';
  }
  return wVar3;
}

Assistant:

int
archive_read_disk_set_uname_lookup(struct archive *_a,
    void *private_data,
    const char * (*lookup_uname)(void *private, la_int64_t uid),
    void (*cleanup_uname)(void *private))
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_set_uname_lookup");

	if (a->cleanup_uname != NULL && a->lookup_uname_data != NULL)
		(a->cleanup_uname)(a->lookup_uname_data);

	a->lookup_uname = lookup_uname;
	a->cleanup_uname = cleanup_uname;
	a->lookup_uname_data = private_data;
	return (ARCHIVE_OK);
}